

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_write_tile_obu_mt
               (AV1_COMP *cpi,uint8_t *dst,uint32_t *total_size,aom_write_bit_buffer *saved_wb,
               uint8_t obu_extn_header,FrameHeaderInfo *fh_info,int *largest_tile_id,
               uint *max_tile_size,uint32_t *obu_header_size,uint8_t **tile_data_start,
               int num_workers)

{
  int tile_idx;
  uint32_t tile_size [512];
  PackBSParams pack_bs_params [512];
  MultiThreadInfo *mt_info;
  undefined8 in_stack_ffffffffffff4798;
  undefined4 in_stack_ffffffffffff47a0;
  undefined4 in_stack_ffffffffffff47a4;
  int local_b84c;
  undefined1 local_b848 [20];
  int in_stack_ffffffffffff47cc;
  AVxWorkerHook in_stack_ffffffffffff47d0;
  PackBSParams *in_stack_ffffffffffff47d8;
  AV1_COMP *in_stack_ffffffffffff47e0;
  int *in_stack_ffffffffffff4818;
  FrameHeaderInfo *in_stack_ffffffffffff4820;
  uint32_t *in_stack_ffffffffffff4828;
  uint8_t *in_stack_ffffffffffff4830;
  PackBSParams *in_stack_ffffffffffff4838;
  AV1_COMP *in_stack_ffffffffffff4840;
  uint *in_stack_ffffffffffff4860;
  uint32_t *in_stack_ffffffffffff4868;
  uint8_t **in_stack_ffffffffffff4870;
  int in_stack_ffffffffffff4878;
  int in_stack_ffffffffffff4954;
  AV1_COMMON *in_stack_ffffffffffff4958;
  MultiThreadInfo *in_stack_ffffffffffff4960;
  long alStack_b030 [524];
  uint8_t in_stack_ffffffffffff6037;
  PackBSParams *in_stack_ffffffffffff6038;
  aom_write_bit_buffer *in_stack_ffffffffffff6040;
  uint8_t *in_stack_ffffffffffff6048;
  AV1_COMP *in_stack_ffffffffffff6050;
  
  memset(local_b848,0,0x800);
  for (local_b84c = 0; local_b84c < 0x200; local_b84c = local_b84c + 1) {
    alStack_b030[(long)local_b84c * 0xb] = (long)(local_b848 + (long)local_b84c * 4);
  }
  init_tile_pack_bs_params
            (in_stack_ffffffffffff6050,in_stack_ffffffffffff6048,in_stack_ffffffffffff6040,
             in_stack_ffffffffffff6038,in_stack_ffffffffffff6037);
  prepare_pack_bs_workers
            (in_stack_ffffffffffff47e0,in_stack_ffffffffffff47d8,in_stack_ffffffffffff47d0,
             in_stack_ffffffffffff47cc);
  launch_workers((MultiThreadInfo *)CONCAT44(in_stack_ffffffffffff47a4,in_stack_ffffffffffff47a0),
                 (int)((ulong)in_stack_ffffffffffff4798 >> 0x20));
  sync_enc_workers(in_stack_ffffffffffff4960,in_stack_ffffffffffff4958,in_stack_ffffffffffff4954);
  accumulate_pack_bs_data
            (in_stack_ffffffffffff4840,in_stack_ffffffffffff4838,in_stack_ffffffffffff4830,
             in_stack_ffffffffffff4828,in_stack_ffffffffffff4820,in_stack_ffffffffffff4818,
             in_stack_ffffffffffff4860,in_stack_ffffffffffff4868,in_stack_ffffffffffff4870,
             in_stack_ffffffffffff4878);
  return;
}

Assistant:

void av1_write_tile_obu_mt(
    AV1_COMP *const cpi, uint8_t *const dst, uint32_t *total_size,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extn_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id,
    unsigned int *max_tile_size, uint32_t *const obu_header_size,
    uint8_t **tile_data_start, const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  PackBSParams pack_bs_params[MAX_TILES];
  uint32_t tile_size[MAX_TILES] = { 0 };

  for (int tile_idx = 0; tile_idx < MAX_TILES; tile_idx++)
    pack_bs_params[tile_idx].total_size = &tile_size[tile_idx];

  init_tile_pack_bs_params(cpi, dst, saved_wb, pack_bs_params, obu_extn_header);
  prepare_pack_bs_workers(cpi, pack_bs_params, pack_bs_worker_hook,
                          num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
  accumulate_pack_bs_data(cpi, pack_bs_params, dst, total_size, fh_info,
                          largest_tile_id, max_tile_size, obu_header_size,
                          tile_data_start, num_workers);
}